

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmGlobal.cpp
# Opt level: O0

uint32 __thiscall Wasm::WasmGlobal::GetGlobalIndexInit(WasmGlobal *this)

{
  Type TVar1;
  WasmCompilationException *this_00;
  WasmGlobal *this_local;
  
  TVar1 = GetReferenceType(this);
  if (TVar1 != LocalReference) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Global must be initialized from another global to retrieve its index");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return (this->m_init).field_1.brTable.numTargets;
}

Assistant:

uint32 WasmGlobal::GetGlobalIndexInit() const
    {
        if (GetReferenceType() != GlobalReferenceTypes::LocalReference)
        {
            throw WasmCompilationException(_u("Global must be initialized from another global to retrieve its index"));
        }
        return m_init.var.num;
    }